

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parsePostcodeSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  UINT8 subtype;
  TreeModel *this_00;
  bool bVar1;
  uint uVar2;
  UINT32 UVar3;
  uint uVar4;
  uint uVar5;
  UINT8 *ffsSize;
  char *pcVar6;
  UByteArray local_190;
  CBString local_170;
  UModelIndex local_158;
  undefined1 local_140 [8];
  CBString info;
  undefined1 local_110 [8];
  CBString name;
  UByteArray body;
  UByteArray header;
  POSTCODE_SECTION *postcodeHeader_1;
  POSTCODE_SECTION *postcodeHeader;
  EFI_COMMON_SECTION_HEADER2 *section2Header;
  EFI_COMMON_SECTION_HEADER *sectionHeader;
  uint uStack_90;
  UINT8 type;
  UINT32 postCode;
  UINT32 headerSize;
  VOLUME_PARSING_DATA *pdata;
  UByteArray data;
  UModelIndex parentVolumeIndex;
  UINT8 ffsVersion;
  bool insertIntoTree_local;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *section_local;
  FfsParser *this_local;
  
  uVar2 = UByteArray::size(section);
  if (uVar2 < 4) {
    this_local = (FfsParser *)0x14;
  }
  else {
    parentVolumeIndex.m._6_1_ = '\x02';
    TreeModel::findParentOfType((UModelIndex *)((long)&data.d.field_2 + 8),this->model,parent,'A');
    bVar1 = UModelIndex::isValid((UModelIndex *)((long)&data.d.field_2 + 8));
    if ((bVar1) &&
       (bVar1 = TreeModel::hasEmptyParsingData
                          (this->model,(UModelIndex *)((long)&data.d.field_2 + 8)), !bVar1)) {
      TreeModel::parsingData
                ((UByteArray *)&pdata,this->model,(UModelIndex *)((long)&data.d.field_2 + 8));
      pcVar6 = UByteArray::constData((UByteArray *)&pdata);
      parentVolumeIndex.m._6_1_ = pcVar6[0x19];
      UByteArray::~UByteArray((UByteArray *)&pdata);
    }
    ffsSize = (UINT8 *)UByteArray::constData(section);
    pcVar6 = UByteArray::constData(section);
    if ((parentVolumeIndex.m._6_1_ == '\x03') &&
       (UVar3 = uint24ToUint32(ffsSize), UVar3 == 0xffffff)) {
      uStack_90 = 0xc;
      sectionHeader._3_1_ = pcVar6[3];
    }
    else {
      uStack_90 = 8;
      sectionHeader._3_1_ = ffsSize[3];
    }
    uVar2 = UByteArray::size(section);
    if (uVar2 < uStack_90) {
      this_local = (FfsParser *)0x14;
    }
    else {
      UByteArray::left((UByteArray *)((long)&body.d.field_2 + 8),section,uStack_90);
      UByteArray::mid((UByteArray *)&name.super_tagbstring.data,section,uStack_90,-1);
      sectionTypeToUString((CBString *)&info.super_tagbstring.data,sectionHeader._3_1_);
      Bstrlib::CBString::operator+
                ((CBString *)local_110,(CBString *)&info.super_tagbstring.data," section");
      Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
      uVar2 = UByteArray::size(section);
      uVar4 = UByteArray::size(section);
      uVar5 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
      UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
      UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      usprintf((CBString *)local_140,
               "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nPostcode: %Xh"
               ,(ulong)sectionHeader._3_1_,(ulong)uVar2,(ulong)uVar4,(ulong)uVar5);
      if (insertIntoTree) {
        this_00 = this->model;
        subtype = ffsSize[3];
        Bstrlib::CBString::CBString(&local_170);
        UByteArray::UByteArray(&local_190);
        TreeModel::addItem(&local_158,this_00,localOffset,'C',subtype,(CBString *)local_110,
                           &local_170,(CBString *)local_140,
                           (UByteArray *)((long)&body.d.field_2 + 8),
                           (UByteArray *)&name.super_tagbstring.data,&local_190,Movable,parent,'\0')
        ;
        index->r = local_158.r;
        index->c = local_158.c;
        index->i = local_158.i;
        index->m = local_158.m;
        UByteArray::~UByteArray(&local_190);
        Bstrlib::CBString::~CBString(&local_170);
      }
      this_local = (FfsParser *)0x0;
      Bstrlib::CBString::~CBString((CBString *)local_140);
      Bstrlib::CBString::~CBString((CBString *)local_110);
      UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
      UByteArray::~UByteArray((UByteArray *)((long)&body.d.field_2 + 8));
    }
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parsePostcodeSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    UINT32 postCode;
    UINT8 type;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const POSTCODE_SECTION* postcodeHeader = (const POSTCODE_SECTION*)(section2Header + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(POSTCODE_SECTION);
        postCode = postcodeHeader->Postcode;
        type = section2Header->Type;
    }
    else { // Normal section
        const POSTCODE_SECTION* postcodeHeader = (const POSTCODE_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(POSTCODE_SECTION);
        postCode = postcodeHeader->Postcode;
        type = sectionHeader->Type;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + (" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nPostcode: %Xh",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size(),
                            postCode);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
    }
    
    return U_SUCCESS;
}